

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy_encode.cpp
# Opt level: O1

void duckdb_brotli::BrotliCreateHuffmanTree
               (uint32_t *data,size_t length,int tree_limit,HuffmanTree *tree,uint8_t *depth)

{
  uint uVar1;
  HuffmanTree HVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  size_t sVar6;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  HuffmanTree *pHVar13;
  int16_t *piVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  
  uVar11 = 1;
  do {
    uVar5 = 0;
    sVar6 = length;
    if (length != 0) {
      do {
        uVar9 = data[sVar6 - 1];
        if (uVar9 != 0) {
          if (uVar9 <= uVar11) {
            uVar9 = uVar11;
          }
          tree[uVar5].total_count_ = uVar9;
          tree[uVar5].index_left_ = -1;
          tree[uVar5].index_right_or_value_ = (short)sVar6 + -1;
          uVar5 = uVar5 + 1;
        }
        sVar6 = sVar6 - 1;
      } while (sVar6 != 0);
    }
    if (uVar5 == 1) {
      depth[tree->index_right_or_value_] = '\x01';
      return;
    }
    if (uVar5 < 0xd) {
      if (uVar5 != 0) {
        uVar7 = 1;
        do {
          HVar2 = tree[uVar7];
          uVar12 = uVar7;
          do {
            uVar10 = uVar12 - 1;
            if (tree[uVar12 - 1].total_count_ == HVar2.total_count_) {
              bVar3 = tree[uVar10].index_right_or_value_ < HVar2.index_right_or_value_;
            }
            else {
              bVar3 = HVar2.total_count_ < tree[uVar12 - 1].total_count_;
            }
            if (!bVar3) goto LAB_01c4b5a8;
            tree[uVar12] = tree[uVar10];
            uVar12 = uVar10;
          } while (uVar10 != 0);
          uVar12 = 0;
LAB_01c4b5a8:
          tree[uVar12] = HVar2;
          uVar7 = uVar7 + 1;
        } while (uVar7 != uVar5);
      }
    }
    else {
      uVar7 = (ulong)((uint)(uVar5 < 0x39) * 2);
      do {
        uVar12 = *(ulong *)(kBrotliShellGaps + uVar7 * 8);
        if (uVar12 < uVar5) {
          pHVar13 = tree + uVar12;
          uVar10 = uVar12;
          piVar14 = &tree->index_right_or_value_;
          do {
            HVar2 = tree[uVar10];
            uVar18 = uVar10;
            if (uVar12 <= uVar10) {
              lVar8 = 0;
              do {
                if (*(uint *)(piVar14 + lVar8 * 4 + -3) == HVar2.total_count_) {
                  bVar3 = piVar14[lVar8 * 4] < HVar2.index_right_or_value_;
                }
                else {
                  bVar3 = HVar2.total_count_ < *(uint *)(piVar14 + lVar8 * 4 + -3);
                }
                if (!bVar3) {
                  uVar18 = lVar8 + uVar10;
                  break;
                }
                pHVar13[lVar8] = *(HuffmanTree *)(piVar14 + lVar8 * 4 + -3);
                lVar8 = lVar8 - uVar12;
                uVar18 = uVar10 + lVar8;
              } while (uVar12 <= uVar18);
            }
            tree[uVar18] = HVar2;
            uVar10 = uVar10 + 1;
            piVar14 = piVar14 + 4;
            pHVar13 = pHVar13 + 1;
          } while (uVar10 != uVar5);
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 != 6);
    }
    pHVar13 = tree + uVar5;
    pHVar13->total_count_ = 0xffffffff;
    pHVar13->index_left_ = -1;
    pHVar13->index_right_or_value_ = -1;
    pHVar13 = tree + uVar5 + 1;
    pHVar13->total_count_ = 0xffffffff;
    pHVar13->index_left_ = -1;
    pHVar13->index_right_or_value_ = -1;
    if (uVar5 != 1) {
      lVar8 = uVar5 + 1;
      uVar7 = 1;
      lVar15 = 0;
      do {
        uVar1 = tree[lVar15].total_count_;
        uVar9 = tree[lVar8].total_count_;
        lVar16 = lVar15;
        if (uVar9 < uVar1) {
          lVar16 = lVar8;
        }
        lVar15 = lVar15 + (ulong)(uVar1 <= uVar9);
        lVar8 = lVar8 + (ulong)(uVar9 < uVar1);
        uVar1 = tree[lVar15].total_count_;
        uVar9 = tree[lVar8].total_count_;
        lVar17 = lVar15;
        if (uVar9 < uVar1) {
          lVar17 = lVar8;
        }
        lVar15 = lVar15 + (ulong)(uVar1 <= uVar9);
        lVar8 = lVar8 + (ulong)(uVar9 < uVar1);
        tree[uVar5 + uVar7].total_count_ = tree[lVar17].total_count_ + tree[lVar16].total_count_;
        tree[uVar5 + uVar7].index_left_ = (int16_t)lVar16;
        tree[uVar5 + uVar7].index_right_or_value_ = (int16_t)lVar17;
        pHVar13 = tree + uVar5 + uVar7 + 1;
        pHVar13->total_count_ = 0xffffffff;
        pHVar13->index_left_ = -1;
        pHVar13->index_right_or_value_ = -1;
        uVar7 = uVar7 + 1;
      } while (uVar5 != uVar7);
    }
    iVar4 = BrotliSetDepth((int)uVar5 * 2 + -1,tree,depth,tree_limit);
    uVar11 = uVar11 * 2;
    if (iVar4 != 0) {
      return;
    }
  } while( true );
}

Assistant:

void duckdb_brotli::BrotliCreateHuffmanTree(const uint32_t* data,
                             const size_t length,
                             const int tree_limit,
                             HuffmanTree* tree,
                             uint8_t* depth) {
  uint32_t count_limit;
  HuffmanTree sentinel;
  InitHuffmanTree(&sentinel, BROTLI_UINT32_MAX, -1, -1);
  /* For block sizes below 64 kB, we never need to do a second iteration
     of this loop. Probably all of our block sizes will be smaller than
     that, so this loop is mostly of academic interest. If we actually
     would need this, we would be better off with the Katajainen algorithm. */
  for (count_limit = 1; ; count_limit *= 2) {
    size_t n = 0;
    size_t i;
    size_t j;
    size_t k;
    for (i = length; i != 0;) {
      --i;
      if (data[i]) {
        const uint32_t count = BROTLI_MAX(uint32_t, data[i], count_limit);
        InitHuffmanTree(&tree[n++], count, -1, (int16_t)i);
      }
    }

    if (n == 1) {
      depth[tree[0].index_right_or_value_] = 1;  /* Only one element. */
      break;
    }

    SortHuffmanTreeItems(tree, n, SortHuffmanTree);

    /* The nodes are:
       [0, n): the sorted leaf nodes that we start with.
       [n]: we add a sentinel here.
       [n + 1, 2n): new parent nodes are added here, starting from
                    (n+1). These are naturally in ascending order.
       [2n]: we add a sentinel at the end as well.
       There will be (2n+1) elements at the end. */
    tree[n] = sentinel;
    tree[n + 1] = sentinel;

    i = 0;      /* Points to the next leaf node. */
    j = n + 1;  /* Points to the next non-leaf node. */
    for (k = n - 1; k != 0; --k) {
      size_t left, right;
      if (tree[i].total_count_ <= tree[j].total_count_) {
        left = i;
        ++i;
      } else {
        left = j;
        ++j;
      }
      if (tree[i].total_count_ <= tree[j].total_count_) {
        right = i;
        ++i;
      } else {
        right = j;
        ++j;
      }

      {
        /* The sentinel node becomes the parent node. */
        size_t j_end = 2 * n - k;
        tree[j_end].total_count_ =
            tree[left].total_count_ + tree[right].total_count_;
        tree[j_end].index_left_ = (int16_t)left;
        tree[j_end].index_right_or_value_ = (int16_t)right;

        /* Add back the last sentinel node. */
        tree[j_end + 1] = sentinel;
      }
    }
    if (BrotliSetDepth((int)(2 * n - 1), &tree[0], depth, tree_limit)) {
      /* We need to pack the Huffman tree in tree_limit bits. If this was not
         successful, add fake entities to the lowest values and retry. */
      break;
    }
  }
}